

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

bool __thiscall BinGE<1,_0,_0>::propagate(BinGE<1,_0,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  int64_t m_v;
  long lVar9;
  TrailElem local_30;
  
  pIVar1 = (this->x).var;
  pIVar2 = (this->y).var;
  iVar6 = (pIVar1->min).v;
  iVar5 = (pIVar2->min).v;
  iVar4 = (pIVar1->max).v;
  iVar3 = -iVar4;
  if (iVar5 == iVar3 || SBORROW4(iVar5,iVar3) != iVar5 + iVar4 < 0) {
LAB_001b67df:
    lVar9 = -(long)iVar6;
    if ((int)lVar9 < (((this->y).var)->max).v) {
      if (so.lazy == true) {
        iVar6 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        lVar7 = (long)iVar6 * 4 + 2;
      }
      else {
        lVar7 = 0;
      }
      pIVar1 = (this->y).var;
      iVar6 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,lVar9,lVar7);
      if ((char)iVar6 == '\0') goto LAB_001b686d;
    }
    iVar6 = (((this->x).var)->max).v;
    iVar4 = -iVar6;
    bVar8 = true;
    iVar5 = (((this->y).var)->max).v;
    if (iVar5 == iVar4 || SBORROW4(iVar5,iVar4) != iVar5 + iVar6 < 0) {
      local_30.pt = (int *)&(this->super_Propagator).satisfied;
      local_30.x = (int)(this->super_Propagator).satisfied.v;
      local_30.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_30);
      (this->super_Propagator).satisfied.v = '\x01';
    }
  }
  else {
    if (so.lazy) {
      iVar4 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[8])();
      lVar9 = (long)iVar4 * 4 + 2;
    }
    else {
      lVar9 = 0;
    }
    pIVar1 = (this->x).var;
    iVar5 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,-(long)iVar5,lVar9);
    if ((char)iVar5 != '\0') goto LAB_001b67df;
LAB_001b686d:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}